

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_graph_expansion_unit_test.cpp
# Opt level: O2

void __thiscall
simplex_tree_expansion_with_blockers_3<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>
::test_method(simplex_tree_expansion_with_blockers_3<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>
              *this)

{
  compact_rbtree_node<void_*> *pcVar1;
  size_holder<true,_unsigned_long,_void> sVar2;
  int iVar3;
  ostream *poVar4;
  Filtration_value *pFVar5;
  size_t sVar6;
  node_ptr pcVar7;
  int vertex;
  Vertex_handle VVar8;
  Siblings *__return_storage_ptr__;
  undefined1 local_208 [8];
  undefined8 local_200;
  undefined1 local_1f8 [32];
  node_ptr local_1d8;
  undefined1 local_1d0 [8];
  __node_base_ptr local_1c8;
  size_holder<true,_unsigned_long,_void> local_1c0;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_std::less<int>,_void,_void>_>
  *local_1b8;
  node_ptr local_1b0;
  size_holder<true,_unsigned_long,_void> local_1a8;
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  __node_base local_170;
  __node_base local_168;
  Simplex_tree<Simplex_tree_options_stable_simplex_handles> simplex_tree;
  undefined1 local_cc [12];
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  std::operator<<((ostream *)&std::clog,
                  "********************************************************************\n");
  std::operator<<((ostream *)&std::clog,"simplex_tree_expansion_with_blockers_3\n");
  std::operator<<((ostream *)&std::clog,
                  "********************************************************************\n");
  simplex_tree.nodes_label_to_list_._M_h._M_buckets =
       &simplex_tree.nodes_label_to_list_._M_h._M_single_bucket;
  simplex_tree.nodes_label_to_list_._M_h._M_bucket_count = 1;
  simplex_tree.nodes_label_to_list_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  simplex_tree.nodes_label_to_list_._M_h._M_element_count = 0;
  simplex_tree.nodes_label_to_list_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  simplex_tree.nodes_label_to_list_._M_h._M_rehash_policy._M_next_resize = 0;
  simplex_tree.nodes_label_to_list_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  simplex_tree.null_vertex_ = -1;
  simplex_tree.root_.oncles_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_std::less<int>,_void,_void>_>
        *)0x0;
  simplex_tree.root_.parent_ = -1;
  simplex_tree.root_.members_.
  super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
  .
  super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
  .m_icont.
  super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
  .holder.root.super_node.left_ =
       (node_ptr)
       ((long)&simplex_tree.root_.members_.
               super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
               .
               super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
               .m_icont.
               super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
       + 8);
  simplex_tree.root_.members_.
  super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
  .
  super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
  .m_icont.
  super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .super_size_holder<true,_unsigned_long,_void>.size_ = 0;
  simplex_tree.root_.members_.
  super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
  .
  super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
  .m_icont.
  super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
  .holder.root.super_node.parent_ = (node_ptr)0x0;
  simplex_tree.filtration_vect_.
  super__Vector_base<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_std::allocator<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  simplex_tree.filtration_vect_.
  super__Vector_base<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_std::allocator<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  simplex_tree.filtration_vect_.
  super__Vector_base<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_std::allocator<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  simplex_tree.dimension_ = -1;
  simplex_tree.dimension_to_be_lowered_ = false;
  local_208 = (undefined1  [8])0x100000000;
  local_1c8 = (__node_base_ptr)0x2;
  local_1f8._24_8_ = (node_ptr)0x0;
  local_1d0 = (undefined1  [8])local_208;
  simplex_tree.root_.members_.
  super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
  .
  super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
  .m_icont.
  super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
  .holder.root.super_node.right_ =
       simplex_tree.root_.members_.
       super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
       .
       super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
       .m_icont.
       super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
       .
       super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
       .
       super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
       .
       super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
       .
       super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
       .holder.root.super_node.left_;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_1f8,
             (initializer_list<int> *)&simplex_tree,(Filtration_value *)local_1d0);
  local_208 = (undefined1  [8])0x200000000;
  local_1c8 = (__node_base_ptr)0x2;
  local_1f8._24_8_ = (node_ptr)0x3ff0000000000000;
  local_1d0 = (undefined1  [8])local_208;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_1f8,
             (initializer_list<int> *)&simplex_tree,(Filtration_value *)local_1d0);
  local_208 = (undefined1  [8])0x300000000;
  local_1c8 = (__node_base_ptr)0x2;
  local_1f8._24_8_ = (node_ptr)0x4000000000000000;
  local_1d0 = (undefined1  [8])local_208;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_1f8,
             (initializer_list<int> *)&simplex_tree,(Filtration_value *)local_1d0);
  local_208 = (undefined1  [8])0x200000001;
  local_1c8 = (__node_base_ptr)0x2;
  local_1f8._24_8_ = (node_ptr)0x4008000000000000;
  local_1d0 = (undefined1  [8])local_208;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_1f8,
             (initializer_list<int> *)&simplex_tree,(Filtration_value *)local_1d0);
  local_208 = (undefined1  [8])0x300000001;
  local_1c8 = (__node_base_ptr)0x2;
  local_1f8._24_8_ = (node_ptr)0x4010000000000000;
  local_1d0 = (undefined1  [8])local_208;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_1f8,
             (initializer_list<int> *)&simplex_tree,(Filtration_value *)local_1d0);
  local_208 = (undefined1  [8])0x300000002;
  local_1c8 = (__node_base_ptr)0x2;
  local_1f8._24_8_ = (node_ptr)0x4014000000000000;
  local_1d0 = (undefined1  [8])local_208;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_1f8,
             (initializer_list<int> *)&simplex_tree,(Filtration_value *)local_1d0);
  local_208 = (undefined1  [8])0x400000002;
  local_1c8 = (__node_base_ptr)0x2;
  local_1f8._24_8_ = (node_ptr)0x4018000000000000;
  local_1d0 = (undefined1  [8])local_208;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_1f8,
             (initializer_list<int> *)&simplex_tree,(Filtration_value *)local_1d0);
  local_208 = (undefined1  [8])0x600000003;
  local_1c8 = (__node_base_ptr)0x2;
  local_1f8._24_8_ = (node_ptr)0x401c000000000000;
  local_1d0 = (undefined1  [8])local_208;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_1f8,
             (initializer_list<int> *)&simplex_tree,(Filtration_value *)local_1d0);
  local_208 = (undefined1  [8])0x500000004;
  local_1c8 = (__node_base_ptr)0x2;
  local_1f8._24_8_ = (node_ptr)0x4020000000000000;
  local_1d0 = (undefined1  [8])local_208;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_1f8,
             (initializer_list<int> *)&simplex_tree,(Filtration_value *)local_1d0);
  local_208 = (undefined1  [8])0x600000004;
  local_1c8 = (__node_base_ptr)0x2;
  local_1f8._24_8_ = (node_ptr)0x4022000000000000;
  local_1d0 = (undefined1  [8])local_208;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_1f8,
             (initializer_list<int> *)&simplex_tree,(Filtration_value *)local_1d0);
  local_208 = (undefined1  [8])0x600000005;
  local_1c8 = (__node_base_ptr)0x2;
  local_1f8._24_8_ = (node_ptr)0x4024000000000000;
  local_1d0 = (undefined1  [8])local_208;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_1f8,
             (initializer_list<int> *)&simplex_tree,(Filtration_value *)local_1d0);
  local_1f8._24_4_ = 6;
  local_1c8 = (__node_base_ptr)0x1;
  local_208 = (undefined1  [8])0x4024000000000000;
  local_1d0 = (undefined1  [8])(local_1f8 + 0x18);
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_1f8,
             (initializer_list<int> *)&simplex_tree,(Filtration_value *)local_1d0);
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  expansion_with_blockers<simplex_tree_expansion_with_blockers_3<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>::test_method()::_lambda(boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<int_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,false>,true>)_1_>
            (&simplex_tree,3,(anon_class_8_1_0c67b935)&simplex_tree);
  poVar4 = std::operator<<((ostream *)&std::clog,"* The complex contains ");
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::num_simplices(&simplex_tree);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4," simplices");
  poVar4 = std::operator<<((ostream *)&std::clog," - dimension ");
  iVar3 = Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::dimension(&simplex_tree)
  ;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  std::operator<<(poVar4,"\n");
  std::operator<<((ostream *)&std::clog,
                  "* Iterator on Simplices in the filtration, with [filtration value]:\n");
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::maybe_initialize_filtration
            (&simplex_tree);
  local_1b0 = (node_ptr)
              simplex_tree.filtration_vect_.
              super__Vector_base<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_std::allocator<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  pcVar7 = (node_ptr)
           simplex_tree.filtration_vect_.
           super__Vector_base<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_std::allocator<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (pcVar7 != local_1b0) {
    pcVar1 = (((tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
                *)&pcVar7->parent_)->members_).nodeptr_;
    local_1a8.size_ = (unsigned_long)pcVar7;
    poVar4 = std::operator<<((ostream *)&std::clog,"   ");
    std::operator<<(poVar4,"[");
    local_168._M_nxt = (_Hash_node_base *)pcVar1;
    pFVar5 = Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::filtration
                       ((Simplex_handle *)&local_168);
    poVar4 = std::ostream::_M_insert<double>(*pFVar5);
    std::operator<<(poVar4,"] ");
    __return_storage_ptr__ = (Siblings *)local_1d0;
    local_170._M_nxt = (_Hash_node_base *)pcVar1;
    Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::simplex_vertex_range
              ((Simplex_vertex_range *)__return_storage_ptr__,&simplex_tree,
               (Simplex_handle *)&local_170);
    sVar2.size_ = local_1c0.size_;
    iVar3 = (int)local_1b8;
    VVar8 = (int)local_1c8;
    while ((__return_storage_ptr__ =
                 (((iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_boost::iterators::incrementable_traversal_tag>
                    *)&__return_storage_ptr__->oncles_)->m_Begin).sib_,
           __return_storage_ptr__ != (Siblings *)sVar2.size_ || (VVar8 != iVar3))) {
      poVar4 = std::operator<<((ostream *)&std::clog,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,VVar8);
      std::operator<<(poVar4,")");
      VVar8 = __return_storage_ptr__->parent_;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
    pcVar7 = (node_ptr)(local_1a8.size_ + 8);
  }
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_graph_expansion_unit_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x81);
  sVar6 = Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::num_simplices
                    (&simplex_tree);
  local_1f8._8_8_ = (node_ptr)0x0;
  local_1f8._16_8_ = (_Hash_node_base *)0x0;
  local_208 = (undefined1  [8])0x14e2c6;
  local_200 = "";
  local_1c8 = (__node_base_ptr)((ulong)local_1c8 & 0xffffffffffffff00);
  local_1d0 = (undefined1  [8])&PTR__lazy_ostream_0016b740;
  local_1c0.size_ = (unsigned_long)&boost::unit_test::lazy_ostream::inst;
  local_1b8 = (Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_std::less<int>,_void,_void>_>
               *)local_208;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_graph_expansion_unit_test.cpp"
  ;
  local_58 = "";
  local_1f8[0] = sVar6 == 0x17;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_1f8 + 0x10));
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_graph_expansion_unit_test.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x82);
  iVar3 = Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::dimension(&simplex_tree)
  ;
  local_1f8[0] = iVar3 == 3;
  local_1f8._8_8_ = (node_ptr)0x0;
  local_1f8._16_8_ = (_Hash_node_base *)0x0;
  local_208 = (undefined1  [8])0x14e2e9;
  local_200 = "";
  local_1c8 = (__node_base_ptr)((ulong)local_1c8 & 0xffffffffffffff00);
  local_1d0 = (undefined1  [8])&PTR__lazy_ostream_0016b740;
  local_1c0.size_ = (unsigned_long)&boost::unit_test::lazy_ostream::inst;
  local_1b8 = (Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_std::less<int>,_void,_void>_>
               *)local_208;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_graph_expansion_unit_test.cpp"
  ;
  local_88 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_1f8 + 0x10));
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_graph_expansion_unit_test.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x84);
  local_208 = (undefined1  [8])local_cc;
  local_cc._0_8_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_std::less<int>,_void,_void>_>
        *)0x500000004;
  local_cc._8_4_ = 6;
  local_200._0_4_ = 3;
  local_200._4_4_ = 0;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)(local_180 + 8),
             (initializer_list<int> *)&simplex_tree);
  local_1f8[0] = (pointer)local_180._8_8_ == (pointer)0x0;
  local_1f8._8_8_ = (node_ptr)0x0;
  local_1f8._16_8_ = (_Hash_node_base *)0x0;
  local_1f8._24_8_ = "simplex_tree.find({4, 5, 6}) == simplex_tree.null_simplex()";
  local_1d8 = (node_ptr)0x14e342;
  local_1c8 = (__node_base_ptr)((ulong)local_1c8 & 0xffffffffffffff00);
  local_1d0 = (undefined1  [8])&PTR__lazy_ostream_0016b740;
  local_1c0.size_ = (unsigned_long)&boost::unit_test::lazy_ostream::inst;
  local_1b8 = (Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_std::less<int>,_void,_void>_>
               *)(local_1f8 + 0x18);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_graph_expansion_unit_test.cpp"
  ;
  local_b8 = "";
  boost::test_tools::tt_detail::report_assertion
            ((Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_std::less<int>,_void,_void>_>
              *)local_1f8,local_1d0,&local_c0,0x84,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1f8 + 0x10));
  local_1f8._0_8_ = (__buckets_ptr)0x100000000;
  local_1f8._8_4_ = 2;
  local_1c8 = (__node_base_ptr)0x3;
  local_1d0 = (undefined1  [8])local_1f8;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_180,
             (initializer_list<int> *)&simplex_tree);
  pFVar5 = Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::filtration
                     ((Simplex_handle *)local_180);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(*pFVar5,4.0,2.220446049250313e-16);
  local_1f8._0_8_ = (__buckets_ptr)0x100000000;
  local_1f8._8_4_ = 3;
  local_1c8 = (__node_base_ptr)0x3;
  local_1d0 = (undefined1  [8])local_1f8;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)(local_190 + 8),
             (initializer_list<int> *)&simplex_tree);
  pFVar5 = Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::filtration
                     ((Simplex_handle *)(local_190 + 8));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(*pFVar5,5.0,2.220446049250313e-16);
  local_1f8._0_8_ = (__buckets_ptr)0x200000000;
  local_1f8._8_4_ = 3;
  local_1c8 = (__node_base_ptr)0x3;
  local_1d0 = (undefined1  [8])local_1f8;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_190,
             (initializer_list<int> *)&simplex_tree);
  pFVar5 = Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::filtration
                     ((Simplex_handle *)local_190);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(*pFVar5,6.0,2.220446049250313e-16);
  local_1f8._0_8_ = (__buckets_ptr)0x200000001;
  local_1f8._8_4_ = 3;
  local_1c8 = (__node_base_ptr)0x3;
  local_1d0 = (undefined1  [8])local_1f8;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)(local_1a0 + 8),
             (initializer_list<int> *)&simplex_tree);
  pFVar5 = Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::filtration
                     ((Simplex_handle *)(local_1a0 + 8));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(*pFVar5,6.0,2.220446049250313e-16);
  local_1f8._0_8_ = (__buckets_ptr)0x100000000;
  local_1f8._8_8_ = (node_ptr)0x300000002;
  local_1c8 = (__node_base_ptr)0x4;
  local_1d0 = (undefined1  [8])local_1f8;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_1a0,
             (initializer_list<int> *)&simplex_tree);
  pFVar5 = Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::filtration
                     ((Simplex_handle *)local_1a0);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(*pFVar5,7.0,2.220446049250313e-16);
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::~Simplex_tree(&simplex_tree);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(simplex_tree_expansion_with_blockers_3, typeST, list_of_tested_variants) {
  std::clog << "********************************************************************\n";
  std::clog << "simplex_tree_expansion_with_blockers_3\n";
  std::clog << "********************************************************************\n";
  using Simplex_handle = typename typeST::Simplex_handle;
  // Construct the Simplex Tree with a 1-skeleton graph example
  typeST simplex_tree;

  simplex_tree.insert_simplex({0, 1}, 0.);
  simplex_tree.insert_simplex({0, 2}, 1.);
  simplex_tree.insert_simplex({0, 3}, 2.);
  simplex_tree.insert_simplex({1, 2}, 3.);
  simplex_tree.insert_simplex({1, 3}, 4.);
  simplex_tree.insert_simplex({2, 3}, 5.);
  simplex_tree.insert_simplex({2, 4}, 6.);
  simplex_tree.insert_simplex({3, 6}, 7.);
  simplex_tree.insert_simplex({4, 5}, 8.);
  simplex_tree.insert_simplex({4, 6}, 9.);
  simplex_tree.insert_simplex({5, 6}, 10.);
  simplex_tree.insert_simplex({6}, 10.);

  simplex_tree.expansion_with_blockers(3, [&](Simplex_handle sh){
      bool result = false;
      std::clog << "Blocker on [";
      // User can loop on the vertices from the given simplex_handle i.e.
      for (auto vertex : simplex_tree.simplex_vertex_range(sh)) {
        // We block the expansion, if the vertex '6' is in the given list of vertices
        if (vertex == 6)
          result = true;
        std::clog << vertex << ", ";
      }
      std::clog << "] ( " << simplex_tree.filtration(sh);
      // User can re-assign a new filtration value directly in the blocker (default is the maximal value of boundaries)
      simplex_tree.assign_filtration(sh, simplex_tree.filtration(sh) + 1.);

      std::clog << " + 1. ) = " << result << std::endl;

      return result;
    });

  std::clog << "* The complex contains " << simplex_tree.num_simplices() << " simplices";
  std::clog << " - dimension " << simplex_tree.dimension() << "\n";
  std::clog << "* Iterator on Simplices in the filtration, with [filtration value]:\n";
  for (auto f_simplex : simplex_tree.filtration_simplex_range()) {
    std::clog << "   " << "[" << simplex_tree.filtration(f_simplex) << "] ";
    for (auto vertex : simplex_tree.simplex_vertex_range(f_simplex))
      std::clog << "(" << vertex << ")";
    std::clog << std::endl;
  }

  BOOST_CHECK(simplex_tree.num_simplices() == 23);
  BOOST_CHECK(simplex_tree.dimension() == 3);
  // {4, 5, 6} shall be blocked
  BOOST_CHECK(simplex_tree.find({4, 5, 6}) == simplex_tree.null_simplex());
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(simplex_tree.filtration(simplex_tree.find({0,1,2})),
                                                          static_cast<typename typeST::Filtration_value>(4.));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(simplex_tree.filtration(simplex_tree.find({0,1,3})),
                                                          static_cast<typename typeST::Filtration_value>(5.));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(simplex_tree.filtration(simplex_tree.find({0,2,3})),
                                                          static_cast<typename typeST::Filtration_value>(6.));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(simplex_tree.filtration(simplex_tree.find({1,2,3})),
                                                          static_cast<typename typeST::Filtration_value>(6.));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(simplex_tree.filtration(simplex_tree.find({0,1,2,3})),
                                                          static_cast<typename typeST::Filtration_value>(7.));

}